

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_unscaleSolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *LP,bool persistent)

{
  Verbosity VVar1;
  byte bVar2;
  SPxOut *pSVar3;
  char *t;
  Verbosity old_verbosity;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar3 = soplex::operator<<(&this->spxout," --- unscaling ");
    t = "internal";
    if (persistent) {
      t = "external";
    }
    pSVar3 = soplex::operator<<(pSVar3,t);
    pSVar3 = soplex::operator<<(pSVar3," solution");
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  (*this->_scaler->_vptr_SPxScaler[0x22])(this->_scaler,LP,&this->_solReal);
  (*this->_scaler->_vptr_SPxScaler[0x23])(this->_scaler,LP,&(this->_solReal)._slacks);
  (*this->_scaler->_vptr_SPxScaler[0x24])(this->_scaler,LP,&(this->_solReal)._dual);
  (*this->_scaler->_vptr_SPxScaler[0x25])(this->_scaler,LP,&(this->_solReal)._redCost);
  bVar2 = (this->_solReal).field_0xe0;
  if ((bVar2 & 2) != 0) {
    (*this->_scaler->_vptr_SPxScaler[0x26])(this->_scaler,LP,&(this->_solReal)._primalRay);
    bVar2 = (this->_solReal).field_0xe0;
  }
  if ((bVar2 & 8) == 0) {
    return;
  }
  (*this->_scaler->_vptr_SPxScaler[0x27])(this->_scaler,LP,&(this->_solReal)._dualFarkas);
  return;
}

Assistant:

void SoPlexBase<R>::_unscaleSolutionReal(SPxLPBase<R>& LP, bool persistent)
{
   SPX_MSG_INFO1(spxout, spxout << " --- unscaling " << (persistent ? "external" : "internal") <<
                 " solution" << std::endl;)
   assert(_scaler);
   assert(!persistent || (boolParam(SoPlexBase<R>::PERSISTENTSCALING) && _isRealLPScaled));
   _scaler->unscalePrimal(LP, _solReal._primal);
   _scaler->unscaleSlacks(LP, _solReal._slacks);
   _scaler->unscaleDual(LP, _solReal._dual);
   _scaler->unscaleRedCost(LP, _solReal._redCost);

   if(_solReal.hasPrimalRay())
      _scaler->unscalePrimalray(LP, _solReal._primalRay);

   if(_solReal.hasDualFarkas())
      _scaler->unscaleDualray(LP, _solReal._dualFarkas);
}